

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.hpp
# Opt level: O0

Image4u * eos::core::image::resize
                    (Image4u *__return_storage_ptr__,Image4u *image,int width,int height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Pixel<unsigned_char,_4> *pPVar4;
  byte *pbVar5;
  Scalar *pSVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  __type_conflict _Var11;
  __type_conflict _Var12;
  __type_conflict _Var13;
  __type_conflict _Var14;
  undefined4 local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  Matrix<int,_4,_1,_0,_4,_1> local_c8;
  int local_b8;
  int local_b4;
  int source_y;
  int source_x;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  Matrix<int,_4,_1,_0,_4,_1> local_88;
  int local_78;
  int local_74;
  int b;
  int a;
  int num_texels;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
  local_60 [8];
  undefined1 local_58 [8];
  Vector4i color;
  float top;
  float bottom;
  float right;
  float left;
  int h;
  int w;
  float scaling_height;
  float scaling_width;
  int height_local;
  int width_local;
  Image4u *image_local;
  Image4u *resized_image;
  
  iVar1 = Image<eos::core::Pixel<unsigned_char,_4>_>::width(image);
  fVar7 = (float)width / (float)iVar1;
  iVar1 = Image<eos::core::Pixel<unsigned_char,_4>_>::height(image);
  fVar8 = (float)height / (float)iVar1;
  Image<eos::core::Pixel<unsigned_char,_4>_>::Image(__return_storage_ptr__,height,width);
  for (left = 0.0; (int)left < width; left = (float)((int)left + 1)) {
    for (right = 0.0; (int)right < height; right = (float)((int)right + 1)) {
      color.super_PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
           (int)(((float)(int)right + 1.0) / fVar8);
      Eigen::DenseBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::Zero();
      Eigen::Matrix<int,4,1,0,4,1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,4,1,0,4,1>>>
                ((Matrix<int,4,1,0,4,1> *)local_58,local_60);
      b = 0;
      dVar10 = std::ceil((double)(ulong)(uint)((float)(int)left / fVar7));
      for (local_74 = (int)SUB84(dVar10,0); fVar9 = (float)local_74,
          dVar10 = std::floor((double)(ulong)(uint)(((float)(int)left + 1.0) / fVar7)),
          fVar9 <= SUB84(dVar10,0); local_74 = local_74 + 1) {
        dVar10 = std::ceil((double)(ulong)(uint)((float)(int)right / fVar8));
        for (local_78 = (int)SUB84(dVar10,0); fVar9 = (float)local_78,
            dVar10 = std::floor((double)(ulong)(uint)color.
                                                  super_PlainObjectBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>
                                                  .m_storage.m_data.array[3]), iVar1 = local_74,
            fVar9 <= SUB84(dVar10,0); local_78 = local_78 + 1) {
          iVar2 = Image<eos::core::Pixel<unsigned_char,_4>_>::width(image);
          iVar3 = local_78;
          if ((iVar1 < iVar2) &&
             (iVar1 = Image<eos::core::Pixel<unsigned_char,_4>_>::height(image), iVar3 < iVar1)) {
            b = b + 1;
            pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,local_78,local_74)
            ;
            pbVar5 = Pixel<unsigned_char,_4>::operator[](pPVar4,0);
            local_8c = (uint)*pbVar5;
            pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,local_78,local_74)
            ;
            pbVar5 = Pixel<unsigned_char,_4>::operator[](pPVar4,1);
            local_90 = (uint)*pbVar5;
            pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,local_78,local_74)
            ;
            pbVar5 = Pixel<unsigned_char,_4>::operator[](pPVar4,2);
            local_94 = (uint)*pbVar5;
            pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,local_78,local_74)
            ;
            pbVar5 = Pixel<unsigned_char,_4>::operator[](pPVar4,3);
            local_98 = (uint)*pbVar5;
            Eigen::Matrix<int,_4,_1,_0,_4,_1>::Matrix
                      (&local_88,(Scalar *)&local_8c,(Scalar *)&local_90,(Scalar *)&local_94,
                       (Scalar *)&local_98);
            Eigen::MatrixBase<Eigen::Matrix<int,4,1,0,4,1>>::operator+=
                      ((MatrixBase<Eigen::Matrix<int,4,1,0,4,1>> *)local_58,
                       (MatrixBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *)&local_88);
          }
        }
      }
      if (b < 1) {
        dVar10 = std::round((double)(ulong)(uint)((float)(int)left / fVar7));
        local_b4 = (int)SUB84(dVar10,0);
        dVar10 = std::round((double)(ulong)(uint)((float)(int)right / fVar8));
        local_b8 = (int)SUB84(dVar10,0);
        iVar3 = Image<eos::core::Pixel<unsigned_char,_4>_>::height(image);
        iVar1 = local_b4;
        if (((int)SUB84(dVar10,0) < iVar3) &&
           (iVar3 = Image<eos::core::Pixel<unsigned_char,_4>_>::width(image), iVar1 < iVar3)) {
          pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,local_b8,local_b4);
          pbVar5 = Pixel<unsigned_char,_4>::operator[](pPVar4,0);
          local_cc = (uint)*pbVar5;
          pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,local_b8,local_b4);
          pbVar5 = Pixel<unsigned_char,_4>::operator[](pPVar4,1);
          local_d0 = (uint)*pbVar5;
          pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,local_b8,local_b4);
          pbVar5 = Pixel<unsigned_char,_4>::operator[](pPVar4,2);
          local_d4 = (uint)*pbVar5;
          pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,local_b8,local_b4);
          pbVar5 = Pixel<unsigned_char,_4>::operator[](pPVar4,3);
          local_d8 = (uint)*pbVar5;
          Eigen::Matrix<int,_4,_1,_0,_4,_1>::Matrix
                    (&local_c8,(Scalar *)&local_cc,(Scalar *)&local_d0,(Scalar *)&local_d4,
                     (Scalar *)&local_d8);
          Eigen::Matrix<int,_4,_1,_0,_4,_1>::operator=
                    ((Matrix<int,_4,_1,_0,_4,_1> *)local_58,&local_c8);
        }
      }
      else {
        Eigen::MatrixBase<Eigen::Matrix<int,4,1,0,4,1>>::operator/
                  ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
                    *)&source_y,(MatrixBase<Eigen::Matrix<int,4,1,0,4,1>> *)local_58,&b);
        Eigen::Matrix<int,4,1,0,4,1>::operator=
                  ((Matrix<int,4,1,0,4,1> *)local_58,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>_>
                    *)&source_y);
      }
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>,_1> *)local_58,0);
      _Var11 = std::round<int>(*pSVar6);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>,_1> *)local_58,1);
      _Var12 = std::round<int>(*pSVar6);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>,_1> *)local_58,2);
      _Var13 = std::round<int>(*pSVar6);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>,_1> *)local_58,3);
      _Var14 = std::round<int>(*pSVar6);
      Pixel<unsigned_char,4>::Pixel<unsigned_char,unsigned_char,unsigned_char,unsigned_char,void>
                ((Pixel<unsigned_char,4> *)&local_dc,(uchar)(int)_Var11,(uchar)(int)_Var12,
                 (uchar)(int)_Var13,(uchar)(int)_Var14);
      pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                         (__return_storage_ptr__,(int)right,(int)left);
      *(undefined4 *)(pPVar4->data_)._M_elems = local_dc;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline eos::core::Image4u resize(const eos::core::Image4u& image, int width, int height)
{
    using Eigen::Vector4i;
    using std::ceil;
    using std::floor;
    using std::round;
    using std::uint8_t;

    const float scaling_width = static_cast<float>(width) / image.width();
    const float scaling_height = static_cast<float>(height) / image.height();

    eos::core::Image4u resized_image(height, width);
    for (int w = 0; w < width; ++w)
    {
        for (int h = 0; h < height; ++h)
        {
            const float left = (static_cast<float>(w)) / scaling_width;
            const float right = (static_cast<float>(w) + 1.0f) / scaling_width;
            const float bottom = (static_cast<float>(h)) / scaling_height;
            const float top = (static_cast<float>(h) + 1.0f) / scaling_height;

            Vector4i color = Vector4i::Zero(); // std::uint8_t actually.
            int num_texels = 0;
            // loop over square in which quadrangle out of the four corners of pixel is
            for (int a = ceil(left); a <= floor(right); ++a)
            {
                for (int b = ceil(bottom); b <= floor(top); ++b)
                {
                    // check if texel is in image
                    if (a < image.width() && b < image.height())
                    {
                        num_texels++;
                        color += Vector4i(image(b, a)[0], image(b, a)[1], image(b, a)[2], image(b, a)[3]);
                    }
                }
            }
            if (num_texels > 0)
                color = color / num_texels;
            else
            { // if no corresponding texel found, nearest neighbour interpolation
              // calculate corresponding position of dst_coord pixel center in image (src)
                const int source_x = round(static_cast<float>(w) / scaling_width);
                const int source_y = round(static_cast<float>(h) / scaling_height);

                if (source_y < image.height() && source_x < image.width())
                {
                    color = Vector4i(image(source_y, source_x)[0], image(source_y, source_x)[1],
                                     image(source_y, source_x)[2], image(source_y, source_x)[3]);
                }
            }

            resized_image(h, w) = {
                static_cast<std::uint8_t>(round(color[0])), static_cast<std::uint8_t>(round(color[1])),
                static_cast<std::uint8_t>(round(color[2])), static_cast<std::uint8_t>(round(color[3]))};
        }
    }

    return resized_image;
}